

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O2

pair<double,_double>
Function_Template::template_ResizeDown(ResizeForm2 Resize,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  TimerContainer timer;
  Image output;
  Image input;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,size,size,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&timer,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,size >> 1,size >> 1,(Image *)&timer);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&timer);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&timer);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&timer);
    (*Resize)(&input,&output);
    Performance_Test::TimerContainer::stop(&timer);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean(&timer.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&timer.super_BaseTimerContainer);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return pVar3;
}

Assistant:

std::pair < double, double > template_ResizeDown( ResizeForm2 Resize, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image input  = Performance_Test::uniformImage( size, size );
        PenguinV_Image::Image output = Performance_Test::uniformImage( size / 2, size / 2 );

        TEST_FUNCTION_LOOP( Resize( input, output ), namespaceName )
    }